

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

count * __thiscall
lest::for_test<lest::count>(lest *this,tests *specification,texts *in,count *perform,int n)

{
  pointer *ppbVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  fd_set *__exceptfds;
  int iVar5;
  fd_set *__writefds;
  long *plVar6;
  long *plVar7;
  undefined4 in_register_00000084;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long local_50;
  
  iVar4 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar4 < 1);
  if (iVar4 == -1 || iVar4 >= 1) {
    plVar7 = *(long **)(this + 8);
    iVar5 = 0;
    do {
      plVar6 = *(long **)this;
      if (plVar6 != plVar7) {
        do {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>((string *)local_90,*plVar6,plVar6[1] + *plVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)specification);
          iVar2 = select((int)(string *)local_90,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                         __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffffb8);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if ((char)iVar2 != '\0') {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,*plVar6,plVar6[1] + *plVar6);
            local_50 = plVar6[4];
            ppbVar1 = &(in->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
          }
          plVar7 = plVar6 + 5;
          plVar6 = plVar7;
        } while (plVar7 != *(long **)(this + 8));
      }
      iVar5 = iVar5 + 1;
      bVar3 = iVar5 < iVar4 || iVar4 == -1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),bVar3);
    } while (bVar3);
  }
  return (count *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}